

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

void __thiscall matrix::print(matrix *this)

{
  int iVar1;
  poly *this_00;
  int i;
  int i_00;
  int j;
  int i_01;
  
  for (i_00 = 0;
      i_00 < (int)((ulong)((long)(this->rows).super_vector<poly,_std::allocator<poly>_>.
                                 super__Vector_base<poly,_std::allocator<poly>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->rows).super_vector<poly,_std::allocator<poly>_>.
                                super__Vector_base<poly,_std::allocator<poly>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 6); i_00 = i_00 + 1) {
    for (i_01 = 0; i_01 < this->ncols; i_01 = i_01 + 1) {
      this_00 = operator[](this,i_00);
      iVar1 = poly::operator[](this_00,i_01);
      std::ostream::operator<<((ostream *)&std::cout,iVar1);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return;
}

Assistant:

void matrix::print() const {
    const auto &B = *this;
    for (int i = 0; i < static_cast<int>(rows.size()); i++) {
        for (int j = 0; j < ncols; j++)
            std::cout << B[i][j];
        std::cout << std::endl;
    }
}